

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equationofstateCmd.cpp
# Opt level: O0

void clear_given(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->input_given = 0;
  args_info->output_given = 0;
  args_info->start_given = 0;
  args_info->end_given = 0;
  args_info->number_given = 0;
  return;
}

Assistant:

static
void clear_given (struct gengetopt_args_info *args_info)
{
  args_info->help_given = 0 ;
  args_info->version_given = 0 ;
  args_info->input_given = 0 ;
  args_info->output_given = 0 ;
  args_info->start_given = 0 ;
  args_info->end_given = 0 ;
  args_info->number_given = 0 ;
}